

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O3

void __thiscall
AddressMap<int>::Iterate(AddressMap<int> *this,FunctionRef<void_(const_void_*,_int_*)> body)

{
  long lVar1;
  Entry *pEVar2;
  Cluster *pCVar3;
  int b;
  long lVar4;
  
  lVar1 = 0;
  do {
    for (pCVar3 = this->hashtable_[lVar1]; pCVar3 != (Cluster *)0x0; pCVar3 = pCVar3->next) {
      lVar4 = 0;
      do {
        for (pEVar2 = pCVar3->blocks[lVar4]; pEVar2 != (Entry *)0x0; pEVar2 = pEVar2->next) {
          (*body.fn)(pEVar2->key,&pEVar2->value,body.data);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x2000);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1000);
  return;
}

Assistant:

void AddressMap<Value>::Iterate(tcmalloc::FunctionRef<void(Key, Value*)> body) const {
  // We could optimize this by traversing only non-empty clusters and/or blocks
  // but it does not speed up heap-checker noticeably.
  for (int h = 0; h < kHashSize; ++h) {
    for (const Cluster* c = hashtable_[h]; c != nullptr; c = c->next) {
      for (int b = 0; b < kClusterBlocks; ++b) {
        for (Entry* e = c->blocks[b]; e != nullptr; e = e->next) {
          body(e->key, &e->value);
        }
      }
    }
  }
}